

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

bool __thiscall Json::Value::operator==(Value *this,Value *other)

{
  bool bVar1;
  ValueType VVar2;
  ValueType VVar3;
  int iVar4;
  size_type sVar5;
  size_type sVar6;
  bool local_91;
  int comp;
  allocator<char> local_59;
  String local_58;
  char *local_38;
  char *other_str;
  char *this_str;
  uint other_len;
  uint this_len;
  Value *other_local;
  Value *this_local;
  
  _other_len = other;
  other_local = this;
  VVar2 = type(this);
  VVar3 = type(_other_len);
  if (VVar2 == VVar3) {
    VVar2 = type(this);
    switch(VVar2) {
    case nullValue:
      this_local._7_1_ = true;
      break;
    case intValue:
      this_local._7_1_ = (this->value_).int_ == (_other_len->value_).int_;
      break;
    case uintValue:
      this_local._7_1_ = (this->value_).int_ == (_other_len->value_).int_;
      break;
    case realValue:
      this_local._7_1_ = (this->value_).real_ == (_other_len->value_).real_;
      break;
    case stringValue:
      if (((this->value_).int_ == 0) || ((_other_len->value_).int_ == 0)) {
        this_local._7_1_ = (this->value_).int_ == (_other_len->value_).int_;
      }
      else {
        bVar1 = isAllocated(this);
        decodePrefixedString(bVar1,(this->value_).string_,(uint *)((long)&this_str + 4),&other_str);
        bVar1 = isAllocated(_other_len);
        decodePrefixedString(bVar1,(_other_len->value_).string_,(uint *)&this_str,&local_38);
        if (this_str._4_4_ == (uint)this_str) {
          if ((other_str == (char *)0x0) || (local_38 == (char *)0x0)) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_58,"assert json failed",&local_59);
            throwLogicError(&local_58);
          }
          iVar4 = memcmp(other_str,local_38,(ulong)this_str._4_4_);
          this_local._7_1_ = iVar4 == 0;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      break;
    case booleanValue:
      this_local._7_1_ = ((this->value_).bool_ & 1U) == ((_other_len->value_).bool_ & 1U);
      break;
    case arrayValue:
    case objectValue:
      sVar5 = std::
              map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
              ::size((this->value_).map_);
      sVar6 = std::
              map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
              ::size((_other_len->value_).map_);
      local_91 = false;
      if (sVar5 == sVar6) {
        local_91 = std::operator==((this->value_).map_,(_other_len->value_).map_);
      }
      this_local._7_1_ = local_91;
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmjsoncpp/src/lib_json/json_value.cpp"
                    ,0x247,"bool Json::Value::operator==(const Value &) const");
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Value::operator==(const Value& other) const {
  if (type() != other.type())
    return false;
  switch (type()) {
  case nullValue:
    return true;
  case intValue:
    return value_.int_ == other.value_.int_;
  case uintValue:
    return value_.uint_ == other.value_.uint_;
  case realValue:
    return value_.real_ == other.value_.real_;
  case booleanValue:
    return value_.bool_ == other.value_.bool_;
  case stringValue: {
    if ((value_.string_ == nullptr) || (other.value_.string_ == nullptr)) {
      return (value_.string_ == other.value_.string_);
    }
    unsigned this_len;
    unsigned other_len;
    char const* this_str;
    char const* other_str;
    decodePrefixedString(this->isAllocated(), this->value_.string_, &this_len,
                         &this_str);
    decodePrefixedString(other.isAllocated(), other.value_.string_, &other_len,
                         &other_str);
    if (this_len != other_len)
      return false;
    JSON_ASSERT(this_str && other_str);
    int comp = memcmp(this_str, other_str, this_len);
    return comp == 0;
  }
  case arrayValue:
  case objectValue:
    return value_.map_->size() == other.value_.map_->size() &&
           (*value_.map_) == (*other.value_.map_);
  default:
    JSON_ASSERT_UNREACHABLE;
  }
  return false; // unreachable
}